

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

int32_t __thiscall
icu_63::RegexMatcher::split
          (RegexMatcher *this,UText *input,UText **dest,int32_t destCapacity,UErrorCode *status)

{
  UText *dest_00;
  int iVar1;
  UBool UVar2;
  int64_t iVar3;
  UText *pUVar4;
  UChar *dest_01;
  int64_t limit;
  undefined1 local_3e0 [8];
  UText remainingText_5;
  UChar *remainingChars_2;
  int32_t remaining16Length_2;
  UErrorCode lengthStatus_2;
  UText remainingText_4;
  undefined1 local_2a8 [4];
  int32_t groupNum;
  UText remainingText_3;
  UChar *remainingChars_1;
  int32_t remaining16Length_1;
  UErrorCode lengthStatus_1;
  UText remainingText_2;
  UText remainingText_1;
  UChar *remainingChars;
  int32_t remaining16Length;
  UErrorCode lengthStatus;
  UText remainingText;
  int32_t numCaptureGroups;
  int32_t i;
  int64_t nextOutputStringStart;
  UErrorCode *status_local;
  int32_t destCapacity_local;
  UText **dest_local;
  UText *input_local;
  RegexMatcher *this_local;
  
  UVar2 = ::U_FAILURE(*status);
  if (UVar2 == '\0') {
    if (destCapacity < 1) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      this_local._4_4_ = 0;
    }
    else {
      reset(this,input);
      _numCaptureGroups = 0;
      if (this->fActiveLimit == 0) {
        this_local._4_4_ = 0;
      }
      else {
        remainingText.privB = UVector32::size(this->fPattern->fGroupMap);
        for (remainingText.privC = 0; iVar1 = (int)_numCaptureGroups,
            remainingText.privC < destCapacity + -1; remainingText.privC = remainingText.privC + 1)
        {
          UVar2 = find(this);
          if (UVar2 == '\0') {
            if (((input->chunkNativeStart == 0) && (this->fInputLength == input->chunkNativeLimit))
               && (this->fInputLength == (long)input->nativeIndexingLimit)) {
              if (dest[remainingText.privC] == (UText *)0x0) {
                memset(&remaining16Length_2,0,0x90);
                remaining16Length_2 = 0x345ad82c;
                remainingText_4.flags = 0x90;
                utext_openUChars_63((UText *)&remaining16Length_2,
                                    input->chunkContents + _numCaptureGroups,
                                    this->fActiveLimit - _numCaptureGroups,status);
                pUVar4 = utext_clone_63((UText *)0x0,(UText *)&remaining16Length_2,'\x01','\0',
                                        status);
                dest[remainingText.privC] = pUVar4;
                utext_close_63((UText *)&remaining16Length_2);
              }
              else {
                pUVar4 = dest[remainingText.privC];
                iVar3 = utext_nativeLength_63(dest[remainingText.privC]);
                utext_replace_63(pUVar4,0,iVar3,input->chunkContents + _numCaptureGroups,
                                 (int)this->fActiveLimit - iVar1,status);
              }
            }
            else {
              remainingChars_2._4_4_ = 0;
              remainingChars_2._0_4_ =
                   utext_extract_63(input,_numCaptureGroups,this->fActiveLimit,(UChar *)0x0,0,
                                    (UErrorCode *)((long)&remainingChars_2 + 4));
              remainingText_5._136_8_ = uprv_malloc_63((long)((int32_t)remainingChars_2 + 1) << 1);
              if ((UChar *)remainingText_5._136_8_ == (UChar *)0x0) {
                *status = U_MEMORY_ALLOCATION_ERROR;
              }
              else {
                utext_extract_63(input,_numCaptureGroups,this->fActiveLimit,
                                 (UChar *)remainingText_5._136_8_,(int32_t)remainingChars_2 + 1,
                                 status);
                if (dest[remainingText.privC] == (UText *)0x0) {
                  memset(local_3e0,0,0x90);
                  local_3e0._0_4_ = 0x345ad82c;
                  remainingText_5.flags = 0x90;
                  utext_openUChars_63((UText *)local_3e0,(UChar *)remainingText_5._136_8_,
                                      (long)(int32_t)remainingChars_2,status);
                  pUVar4 = utext_clone_63((UText *)0x0,(UText *)local_3e0,'\x01','\0',status);
                  dest[remainingText.privC] = pUVar4;
                  utext_close_63((UText *)local_3e0);
                }
                else {
                  pUVar4 = dest[remainingText.privC];
                  iVar3 = utext_nativeLength_63(dest[remainingText.privC]);
                  utext_replace_63(pUVar4,0,iVar3,(UChar *)remainingText_5._136_8_,
                                   (int32_t)remainingChars_2,status);
                }
                uprv_free_63((void *)remainingText_5._136_8_);
              }
            }
            goto LAB_0017cdd4;
          }
          if (((input->chunkNativeStart == 0) && (this->fInputLength == input->chunkNativeLimit)) &&
             (this->fInputLength == (long)input->nativeIndexingLimit)) {
            if (dest[remainingText.privC] == (UText *)0x0) {
              memset(&remaining16Length_1,0,0x90);
              remaining16Length_1 = 0x345ad82c;
              remainingText_2.flags = 0x90;
              utext_openUChars_63((UText *)&remaining16Length_1,
                                  input->chunkContents + _numCaptureGroups,
                                  this->fMatchStart - _numCaptureGroups,status);
              pUVar4 = utext_clone_63((UText *)0x0,(UText *)&remaining16Length_1,'\x01','\0',status)
              ;
              dest[remainingText.privC] = pUVar4;
              utext_close_63((UText *)&remaining16Length_1);
            }
            else {
              pUVar4 = dest[remainingText.privC];
              iVar3 = utext_nativeLength_63(dest[remainingText.privC]);
              utext_replace_63(pUVar4,0,iVar3,input->chunkContents + _numCaptureGroups,
                               (int)this->fMatchStart - iVar1,status);
            }
          }
          else {
            remainingChars_1._4_4_ = 0;
            remainingChars_1._0_4_ =
                 utext_extract_63(input,_numCaptureGroups,this->fMatchStart,(UChar *)0x0,0,
                                  (UErrorCode *)((long)&remainingChars_1 + 4));
            remainingText_3._136_8_ = uprv_malloc_63((long)((int32_t)remainingChars_1 + 1) << 1);
            if ((UChar *)remainingText_3._136_8_ == (UChar *)0x0) {
              *status = U_MEMORY_ALLOCATION_ERROR;
              goto LAB_0017cdd4;
            }
            utext_extract_63(input,_numCaptureGroups,this->fMatchStart,
                             (UChar *)remainingText_3._136_8_,(int32_t)remainingChars_1 + 1,status);
            if (dest[remainingText.privC] == (UText *)0x0) {
              memset(local_2a8,0,0x90);
              local_2a8 = (undefined1  [4])0x345ad82c;
              remainingText_3.flags = 0x90;
              utext_openUChars_63((UText *)local_2a8,(UChar *)remainingText_3._136_8_,
                                  (long)(int32_t)remainingChars_1,status);
              pUVar4 = utext_clone_63((UText *)0x0,(UText *)local_2a8,'\x01','\0',status);
              dest[remainingText.privC] = pUVar4;
              utext_close_63((UText *)local_2a8);
            }
            else {
              pUVar4 = dest[remainingText.privC];
              iVar3 = utext_nativeLength_63(dest[remainingText.privC]);
              utext_replace_63(pUVar4,0,iVar3,(UChar *)remainingText_3._136_8_,
                               (int32_t)remainingChars_1,status);
            }
            uprv_free_63((void *)remainingText_3._136_8_);
          }
          _numCaptureGroups = this->fMatchEnd;
          remainingText_4.privC = 1;
          while ((remainingText_4.privC <= remainingText.privB &&
                 (remainingText.privC < destCapacity + -2))) {
            remainingText.privC = remainingText.privC + 1;
            pUVar4 = this->fInputText;
            dest_00 = dest[remainingText.privC];
            iVar3 = start64(this,remainingText_4.privC,status);
            limit = end64(this,remainingText_4.privC,status);
            pUVar4 = utext_extract_replace(pUVar4,dest_00,iVar3,limit,status);
            dest[remainingText.privC] = pUVar4;
            remainingText_4.privC = remainingText_4.privC + 1;
          }
          if (_numCaptureGroups == this->fActiveLimit) {
            if (remainingText.privC + 1 < destCapacity) {
              remainingText.privC = remainingText.privC + 1;
              if (dest[remainingText.privC] == (UText *)0x0) {
                pUVar4 = utext_openUChars_63((UText *)0x0,(UChar *)0x0,0,status);
                dest[remainingText.privC] = pUVar4;
              }
              else {
                pUVar4 = dest[remainingText.privC];
                iVar3 = utext_nativeLength_63(dest[remainingText.privC]);
                utext_replace_63(pUVar4,0,iVar3,L"",0,status);
              }
            }
            goto LAB_0017cdd4;
          }
          UVar2 = ::U_FAILURE(*status);
          if (UVar2 != '\0') goto LAB_0017cdd4;
        }
        remainingText.privC = destCapacity + -1;
        if (_numCaptureGroups < this->fActiveLimit) {
          if (((input->chunkNativeStart == 0) && (this->fInputLength == input->chunkNativeLimit)) &&
             (this->fInputLength == (long)input->nativeIndexingLimit)) {
            if (dest[remainingText.privC] == (UText *)0x0) {
              memset(&remaining16Length,0,0x90);
              remaining16Length = 0x345ad82c;
              remainingText.flags = 0x90;
              utext_openUChars_63((UText *)&remaining16Length,
                                  input->chunkContents + _numCaptureGroups,
                                  this->fActiveLimit - _numCaptureGroups,status);
              pUVar4 = utext_clone_63((UText *)0x0,(UText *)&remaining16Length,'\x01','\0',status);
              dest[remainingText.privC] = pUVar4;
              utext_close_63((UText *)&remaining16Length);
            }
            else {
              pUVar4 = dest[remainingText.privC];
              iVar3 = utext_nativeLength_63(dest[remainingText.privC]);
              utext_replace_63(pUVar4,0,iVar3,input->chunkContents + _numCaptureGroups,
                               (int)this->fActiveLimit - iVar1,status);
            }
          }
          else {
            remainingChars._4_4_ = 0;
            remainingChars._0_4_ =
                 utext_extract_63(input,_numCaptureGroups,this->fActiveLimit,(UChar *)0x0,0,
                                  (UErrorCode *)((long)&remainingChars + 4));
            dest_01 = (UChar *)uprv_malloc_63((long)((int32_t)remainingChars + 1) << 1);
            if (dest_01 == (UChar *)0x0) {
              *status = U_MEMORY_ALLOCATION_ERROR;
            }
            else {
              utext_extract_63(input,_numCaptureGroups,this->fActiveLimit,dest_01,
                               (int32_t)remainingChars + 1,status);
              if (dest[remainingText.privC] == (UText *)0x0) {
                memset(&remainingText_2.privB,0,0x90);
                remainingText_2.privB = 0x345ad82c;
                utext_openUChars_63((UText *)&remainingText_2.privB,dest_01,
                                    (long)(int32_t)remainingChars,status);
                pUVar4 = utext_clone_63((UText *)0x0,(UText *)&remainingText_2.privB,'\x01','\0',
                                        status);
                dest[remainingText.privC] = pUVar4;
                utext_close_63((UText *)&remainingText_2.privB);
              }
              else {
                pUVar4 = dest[remainingText.privC];
                iVar3 = utext_nativeLength_63(dest[remainingText.privC]);
                utext_replace_63(pUVar4,0,iVar3,dest_01,(int32_t)remainingChars,status);
              }
              uprv_free_63(dest_01);
            }
          }
        }
LAB_0017cdd4:
        this_local._4_4_ = remainingText.privC + 1;
      }
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t  RegexMatcher::split(UText *input,
        UText           *dest[],
        int32_t          destCapacity,
        UErrorCode      &status)
{
    //
    // Check arguements for validity
    //
    if (U_FAILURE(status)) {
        return 0;
    };

    if (destCapacity < 1) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    //
    // Reset for the input text
    //
    reset(input);
    int64_t   nextOutputStringStart = 0;
    if (fActiveLimit == 0) {
        return 0;
    }

    //
    // Loop through the input text, searching for the delimiter pattern
    //
    int32_t i;
    int32_t numCaptureGroups = fPattern->fGroupMap->size();
    for (i=0; ; i++) {
        if (i>=destCapacity-1) {
            // There is one or zero output string left.
            // Fill the last output string with whatever is left from the input, then exit the loop.
            //  ( i will be == destCapacity if we filled the output array while processing
            //    capture groups of the delimiter expression, in which case we will discard the
            //    last capture group saved in favor of the unprocessed remainder of the
            //    input string.)
            i = destCapacity-1;
            if (fActiveLimit > nextOutputStringStart) {
                if (UTEXT_FULL_TEXT_IN_CHUNK(input, fInputLength)) {
                    if (dest[i]) {
                        utext_replace(dest[i], 0, utext_nativeLength(dest[i]),
                                      input->chunkContents+nextOutputStringStart,
                                      (int32_t)(fActiveLimit-nextOutputStringStart), &status);
                    } else {
                        UText remainingText = UTEXT_INITIALIZER;
                        utext_openUChars(&remainingText, input->chunkContents+nextOutputStringStart,
                                         fActiveLimit-nextOutputStringStart, &status);
                        dest[i] = utext_clone(NULL, &remainingText, TRUE, FALSE, &status);
                        utext_close(&remainingText);
                    }
                } else {
                    UErrorCode lengthStatus = U_ZERO_ERROR;
                    int32_t remaining16Length =
                        utext_extract(input, nextOutputStringStart, fActiveLimit, NULL, 0, &lengthStatus);
                    UChar *remainingChars = (UChar *)uprv_malloc(sizeof(UChar)*(remaining16Length+1));
                    if (remainingChars == NULL) {
                        status = U_MEMORY_ALLOCATION_ERROR;
                        break;
                    }

                    utext_extract(input, nextOutputStringStart, fActiveLimit, remainingChars, remaining16Length+1, &status);
                    if (dest[i]) {
                        utext_replace(dest[i], 0, utext_nativeLength(dest[i]), remainingChars, remaining16Length, &status);
                    } else {
                        UText remainingText = UTEXT_INITIALIZER;
                        utext_openUChars(&remainingText, remainingChars, remaining16Length, &status);
                        dest[i] = utext_clone(NULL, &remainingText, TRUE, FALSE, &status);
                        utext_close(&remainingText);
                    }

                    uprv_free(remainingChars);
                }
            }
            break;
        }
        if (find()) {
            // We found another delimiter.  Move everything from where we started looking
            //  up until the start of the delimiter into the next output string.
            if (UTEXT_FULL_TEXT_IN_CHUNK(input, fInputLength)) {
                if (dest[i]) {
                    utext_replace(dest[i], 0, utext_nativeLength(dest[i]),
                                  input->chunkContents+nextOutputStringStart,
                                  (int32_t)(fMatchStart-nextOutputStringStart), &status);
                } else {
                    UText remainingText = UTEXT_INITIALIZER;
                    utext_openUChars(&remainingText, input->chunkContents+nextOutputStringStart,
                                      fMatchStart-nextOutputStringStart, &status);
                    dest[i] = utext_clone(NULL, &remainingText, TRUE, FALSE, &status);
                    utext_close(&remainingText);
                }
            } else {
                UErrorCode lengthStatus = U_ZERO_ERROR;
                int32_t remaining16Length = utext_extract(input, nextOutputStringStart, fMatchStart, NULL, 0, &lengthStatus);
                UChar *remainingChars = (UChar *)uprv_malloc(sizeof(UChar)*(remaining16Length+1));
                if (remainingChars == NULL) {
                    status = U_MEMORY_ALLOCATION_ERROR;
                    break;
                }
                utext_extract(input, nextOutputStringStart, fMatchStart, remainingChars, remaining16Length+1, &status);
                if (dest[i]) {
                    utext_replace(dest[i], 0, utext_nativeLength(dest[i]), remainingChars, remaining16Length, &status);
                } else {
                    UText remainingText = UTEXT_INITIALIZER;
                    utext_openUChars(&remainingText, remainingChars, remaining16Length, &status);
                    dest[i] = utext_clone(NULL, &remainingText, TRUE, FALSE, &status);
                    utext_close(&remainingText);
                }

                uprv_free(remainingChars);
            }
            nextOutputStringStart = fMatchEnd;

            // If the delimiter pattern has capturing parentheses, the captured
            //  text goes out into the next n destination strings.
            int32_t groupNum;
            for (groupNum=1; groupNum<=numCaptureGroups; groupNum++) {
                if (i >= destCapacity-2) {
                    // Never fill the last available output string with capture group text.
                    // It will filled with the last field, the remainder of the
                    //  unsplit input text.
                    break;
                }
                i++;
                dest[i] = utext_extract_replace(fInputText, dest[i],
                                               start64(groupNum, status), end64(groupNum, status), &status);
            }

            if (nextOutputStringStart == fActiveLimit) {
                // The delimiter was at the end of the string.  We're done, but first
                // we output one last empty string, for the empty field following
                //   the delimiter at the end of input.
                if (i+1 < destCapacity) {
                    ++i;
                    if (dest[i] == NULL) {
                        dest[i] = utext_openUChars(NULL, NULL, 0, &status);
                    } else {
                        static const UChar emptyString[] = {(UChar)0};
                        utext_replace(dest[i], 0, utext_nativeLength(dest[i]), emptyString, 0, &status);
                    }
                }
                break;

            }
        }
        else
        {
            // We ran off the end of the input while looking for the next delimiter.
            // All the remaining text goes into the current output string.
            if (UTEXT_FULL_TEXT_IN_CHUNK(input, fInputLength)) {
                if (dest[i]) {
                    utext_replace(dest[i], 0, utext_nativeLength(dest[i]),
                                  input->chunkContents+nextOutputStringStart,
                                  (int32_t)(fActiveLimit-nextOutputStringStart), &status);
                } else {
                    UText remainingText = UTEXT_INITIALIZER;
                    utext_openUChars(&remainingText, input->chunkContents+nextOutputStringStart,
                                     fActiveLimit-nextOutputStringStart, &status);
                    dest[i] = utext_clone(NULL, &remainingText, TRUE, FALSE, &status);
                    utext_close(&remainingText);
                }
            } else {
                UErrorCode lengthStatus = U_ZERO_ERROR;
                int32_t remaining16Length = utext_extract(input, nextOutputStringStart, fActiveLimit, NULL, 0, &lengthStatus);
                UChar *remainingChars = (UChar *)uprv_malloc(sizeof(UChar)*(remaining16Length+1));
                if (remainingChars == NULL) {
                    status = U_MEMORY_ALLOCATION_ERROR;
                    break;
                }

                utext_extract(input, nextOutputStringStart, fActiveLimit, remainingChars, remaining16Length+1, &status);
                if (dest[i]) {
                    utext_replace(dest[i], 0, utext_nativeLength(dest[i]), remainingChars, remaining16Length, &status);
                } else {
                    UText remainingText = UTEXT_INITIALIZER;
                    utext_openUChars(&remainingText, remainingChars, remaining16Length, &status);
                    dest[i] = utext_clone(NULL, &remainingText, TRUE, FALSE, &status);
                    utext_close(&remainingText);
                }

                uprv_free(remainingChars);
            }
            break;
        }
        if (U_FAILURE(status)) {
            break;
        }
    }   // end of for loop
    return i+1;
}